

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O0

Downloader_libcurl * __thiscall
Downloader_libcurl::getFileNameFromURL(Downloader_libcurl *this,string *downloadURL)

{
  char *pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  ulong in_RDX;
  bool local_89;
  allocator local_59;
  string local_58 [32];
  int local_38;
  int i;
  allocator local_22;
  undefined1 local_21;
  ulong local_20;
  string *downloadURL_local;
  Downloader_libcurl *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  downloadURL_local = downloadURL;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  local_38 = std::__cxx11::string::length();
  while (local_38 = local_38 + -1, -1 < local_38) {
    pcVar1 = (char *)std::__cxx11::string::operator[](local_20);
    local_89 = false;
    if (*pcVar1 == '/') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"",&local_59);
      local_89 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    if (local_89 != false) break;
    pcVar1 = (char *)std::__cxx11::string::operator[](local_20);
    std::__cxx11::string::operator+=((string *)this,*pcVar1);
  }
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
  return this;
}

Assistant:

std::string Downloader_libcurl::getFileNameFromURL(const std::string &downloadURL)
{
    std::string result = std::string("");
    for (int i = downloadURL.length() - 1; i >= 0; i--)
    {
        if (downloadURL[i] == '/' && result != std::string("")) break;
        result += downloadURL[i];
    }
    std::reverse(result.begin(), result.end());
    return result;
}